

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase43::run(TestCase43 *this)

{
  int *params;
  Builder builder;
  ClientHook *pCVar1;
  PromiseNode *pPVar2;
  long *plVar3;
  CapTableBuilder *pCVar4;
  Disposer *pDVar5;
  RequestHook *pRVar6;
  undefined8 uVar7;
  SegmentBuilder *pSVar8;
  undefined8 uVar9;
  SegmentBuilder *pSVar10;
  WirePointer *pWVar11;
  undefined4 uVar12;
  int iVar13;
  TransformPromiseNodeBase *this_00;
  PromiseNode *pPVar14;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int in_R8D;
  Own<capnp::ClientHook> OVar15;
  Reader RVar16;
  bool barFailed;
  int callCount;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_test_c__:62:7),_capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>_>
  promise3;
  Client client;
  WaitScope waitScope;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response1;
  RemotePromise<capnproto_test::capnp::test::TestInterface::BazResults> promise2;
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> promise1;
  Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  request2;
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  request3;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request1;
  Response<capnproto_test::capnp::test::TestInterface::BazResults> response2;
  EventLoop loop;
  undefined1 local_3f5 [5];
  Own<kj::_::PromiseNode> local_3f0;
  undefined1 local_3e0 [8];
  Client local_3d8;
  WaitScope local_3c8;
  Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> local_3b8;
  WirePointer *local_3a0;
  short local_394;
  undefined4 local_390;
  undefined8 *local_388;
  long *local_380;
  Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  local_378;
  SegmentBuilder *local_340;
  CapTableBuilder *local_338;
  undefined8 *in_stack_fffffffffffffcd0;
  WirePointer *in_stack_fffffffffffffcd8;
  long in_stack_fffffffffffffce0;
  Disposer *in_stack_fffffffffffffce8;
  RequestHook *in_stack_fffffffffffffcf0;
  Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  local_308;
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  local_2d0;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_298;
  ArrayPtr<const_char> local_260 [3];
  undefined8 *local_230;
  long *local_228;
  StructBuilder local_220;
  ExceptionOrValue local_1f8;
  char local_98;
  EventLoop local_90;
  Maybe<capnp::MessageSize> local_58;
  Maybe<capnp::MessageSize> local_40;
  Maybe<capnp::MessageSize> local_28;
  
  kj::EventLoop::EventLoop(&local_90);
  local_3c8.busyPollInterval = 0xffffffff;
  local_3c8.loop = &local_90;
  kj::EventLoop::enterScope(&local_90);
  params = (int *)(local_3f5 + 1);
  local_3f5._1_4_ = 0;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&local_3b8,params);
  pPVar14 = local_3b8.super_PromiseBase.node.ptr;
  local_1f8.exception.ptr._0_8_ = local_3b8.super_PromiseBase.node.disposer;
  local_1f8.exception.ptr.field_1.value.ownFile.content.ptr =
       (char *)(local_3b8.super_PromiseBase.node.ptr + 2);
  if (local_3b8.super_PromiseBase.node.ptr == (PromiseNode *)0x0) {
    local_1f8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)(Server *)0x0;
  }
  local_3b8.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  OVar15 = Capability::Client::makeLocalClient
                     (&local_3d8,(Own<capnp::Capability::Server> *)&local_1f8);
  uVar9 = local_1f8.exception.ptr.field_1.value.ownFile.content.ptr;
  if ((Server *)local_1f8.exception.ptr.field_1.value.ownFile.content.ptr != (Server *)0x0) {
    local_1f8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)((SegmentReader *)local_1f8.exception.ptr._0_8_)->arena->_vptr_Arena)
              (local_1f8.exception.ptr._0_8_,(char *)(uVar9 + *(long *)(*(long *)uVar9 + -0x10)),
               OVar15.ptr);
  }
  pPVar2 = local_3b8.super_PromiseBase.node.ptr;
  local_3e0 = (undefined1  [8])&Capability::Client::typeinfo;
  if ((Server *)local_3b8.super_PromiseBase.node.ptr != (Server *)0x0) {
    local_3b8.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    (*(code *)((SegmentReader *)&(local_3b8.super_PromiseBase.node.disposer)->_vptr_Disposer)->arena
              ->_vptr_Arena)
              (local_3b8.super_PromiseBase.node.disposer,
               (_func_int *)((long)&pPVar2->_vptr_PromiseNode + (long)pPVar2->_vptr_PromiseNode[-2])
              );
  }
  local_28.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            (&local_298,(Client *)local_3e0,&local_28);
  *(undefined4 *)local_298.super_Builder._builder.data = 0x7b;
  *(byte *)((long)local_298.super_Builder._builder.data + 4) =
       *(byte *)((long)local_298.super_Builder._builder.data + 4) | 1;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)&local_340,(int)&local_298,__buf,(size_t)pPVar14,in_R8D);
  local_40.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::bazRequest
            (&local_308,(Client *)local_3e0,&local_40);
  local_1f8.exception.ptr._0_8_ = local_308.super_Builder._builder.segment;
  local_1f8.exception.ptr.field_1.value.ownFile.content.ptr =
       (char *)local_308.super_Builder._builder.capTable;
  local_1f8.exception.ptr.field_1.value.ownFile.content.size_ =
       (size_t)local_308.super_Builder._builder.pointers;
  PointerBuilder::initStruct(&local_220,(PointerBuilder *)&local_1f8,(StructSize)0x140006);
  builder._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffcd8;
  builder._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffcd0;
  builder._builder.data = (void *)in_stack_fffffffffffffce0;
  builder._builder.pointers = (WirePointer *)in_stack_fffffffffffffce8;
  builder._builder._32_8_ = in_stack_fffffffffffffcf0;
  initTestMessage(builder);
  Request<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  ::send(&local_378,(int)&local_308,__buf_00,(size_t)pPVar14,in_R8D);
  local_3f5[0] = '\0';
  local_58.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::barRequest
            (&local_2d0,(Client *)local_3e0,&local_58);
  Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
          *)&local_1f8,(int)&local_2d0,__buf_01,(size_t)pPVar14,in_R8D);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)&local_1f8,
             kj::_::
             TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:62:7),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++:64:10)>
             ::anon_class_1_0_00000001_for_func::operator());
  uVar7 = local_1f8.exception.ptr.field_1._32_8_;
  uVar9 = local_1f8.exception.ptr.field_1.value.file;
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0062b920;
  this_00[1].dependency.disposer = (Disposer *)local_3f5;
  local_3f0.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,capnp::Response<capnproto_test::capnp::test::TestInterface::BarResults>,capnp::_::(anonymous_namespace)::TestCase43::run()::$_0,capnp::_::(anonymous_namespace)::TestCase43::run()::$_1>>
        ::instance;
  local_3f0.ptr = (PromiseNode *)this_00;
  if (local_1f8.exception.ptr.field_1.value.file != (char *)0x0) {
    local_1f8.exception.ptr.field_1.value.file = (char *)0x0;
    local_1f8.exception.ptr.field_1._32_8_ = (Disposer *)0x0;
    (***(_func_int ***)local_1f8.exception.ptr.field_1.value.description.content.ptr)
              (local_1f8.exception.ptr.field_1.value.description.content.ptr,uVar9,8,uVar7,uVar7,0);
  }
  uVar9 = local_1f8.exception.ptr.field_1.value.ownFile.content.disposer;
  if ((WirePointer *)local_1f8.exception.ptr.field_1.value.ownFile.content.disposer !=
      (WirePointer *)0x0) {
    local_1f8.exception.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x0;
    (**(code **)*(WirePointer *)local_1f8.exception.ptr.field_1.value.ownFile.content.size_)
              (local_1f8.exception.ptr.field_1.value.ownFile.content.size_,
               (long)&((WireValue<uint32_t>_conflict *)
                      &((ArrayDisposer *)uVar9)->_vptr_ArrayDisposer)->value +
               *(long *)(*(long *)&((ArrayDisposer *)uVar9)->_vptr_ArrayDisposer + -0x10));
  }
  uVar9 = local_1f8.exception.ptr.field_1.value.ownFile.content.ptr;
  if ((Server *)local_1f8.exception.ptr.field_1.value.ownFile.content.ptr != (Server *)0x0) {
    local_1f8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    (*(code *)((SegmentReader *)local_1f8.exception.ptr._0_8_)->arena->_vptr_Arena)
              (local_1f8.exception.ptr._0_8_,(char *)(uVar9 + *(long *)(*(long *)uVar9 + -0x10)));
  }
  if ((local_3f5._1_4_ != 0) && (kj::_::Debug::minSeverity < 3)) {
    local_1f8.exception.ptr._0_8_ = local_1f8.exception.ptr._0_8_ & 0xffffffff00000000;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x45,ERROR,"\"failed: expected \" \"(0) == (callCount)\", 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",(int *)&local_1f8,params);
  }
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            (&local_3b8,&local_340);
  local_1f8.exception.ptr.field_1.value.ownFile.content.ptr =
       (char *)local_3b8.super_PromiseBase.node.ptr;
  local_1f8.exception.ptr.field_1.value.ownFile.content.size_ = (size_t)local_3a0;
  local_1f8.exception.ptr._0_8_ = local_3b8.super_PromiseBase.node.disposer;
  uVar12 = local_390;
  if (local_394 == 0) {
    local_1f8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)(Server *)0x0;
    local_1f8.exception.ptr.field_1.value.ownFile.content.size_ = (size_t)(WirePointer *)0x0;
    local_1f8.exception.ptr._0_8_ = (SegmentBuilder *)0x0;
    uVar12 = 0x7fffffff;
  }
  local_1f8.exception.ptr.field_1._16_4_ = uVar12;
  RVar16 = PointerReader::getBlob<capnp::Text>((PointerReader *)&local_1f8,(void *)0x0,0);
  pSVar10 = (SegmentBuilder *)local_3b8.super_PromiseBase.node.disposer;
  pWVar11 = local_3a0;
  pSVar8 = (SegmentBuilder *)local_1f8.exception.ptr._0_8_;
  uVar9 = local_1f8.exception.ptr.field_1.value.ownFile.content.size_;
  if (((RVar16.super_StringPtr.content.size_ != 4) ||
      (iVar13 = bcmp(RVar16.super_StringPtr.content.ptr,"foo",3),
      pSVar8 = (SegmentBuilder *)local_1f8.exception.ptr._0_8_,
      uVar9 = local_1f8.exception.ptr.field_1.value.ownFile.content.size_,
      pSVar10 = (SegmentBuilder *)local_3b8.super_PromiseBase.node.disposer, pWVar11 = local_3a0,
      iVar13 != 0)) &&
     (local_1f8.exception.ptr.field_1.value.ownFile.content.size_ = (size_t)pWVar11,
     local_1f8.exception.ptr._0_8_ = pSVar10, kj::_::Debug::minSeverity < 3)) {
    local_1f8.exception.ptr.field_1.value.ownFile.content.ptr =
         (char *)local_3b8.super_PromiseBase.node.ptr;
    if (local_394 == 0) {
      local_390 = 0x7fffffff;
      local_1f8.exception.ptr.field_1.value.ownFile.content.size_ = (size_t)(WirePointer *)0x0;
      local_1f8.exception.ptr._0_8_ = (SegmentBuilder *)0x0;
      local_1f8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)(Server *)0x0;
    }
    local_1f8.exception.ptr.field_1._20_4_ =
         (undefined4)((ulong)local_1f8.exception.ptr.field_1.value.ownFile.content.disposer >> 0x20)
    ;
    local_1f8.exception.ptr.field_1._16_4_ = local_390;
    local_260[0] = (ArrayPtr<const_char>)
                   PointerReader::getBlob<capnp::Text>((PointerReader *)&local_1f8,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x49,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (response1.getX())\", \"foo\", response1.getX()"
               ,(char (*) [47])"failed: expected (\"foo\") == (response1.getX())",
               (char (*) [4])0x4fa6a4,(Reader *)local_260);
    pSVar8 = (SegmentBuilder *)local_1f8.exception.ptr._0_8_;
    uVar9 = local_1f8.exception.ptr.field_1.value.ownFile.content.size_;
  }
  local_1f8.exception.ptr.field_1.value.ownFile.content.size_ = uVar9;
  local_1f8.exception.ptr._0_8_ = pSVar8;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BazResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::BazResults>_> *)
             local_260,&local_378);
  local_1f8.exception.ptr._0_8_ = local_1f8.exception.ptr._0_8_ & 0xffffffffffffff00;
  local_98 = '\0';
  kj::_::waitImpl(&local_3f0,&local_1f8,&local_3c8);
  if (local_98 == '\x01') {
    if (local_1f8.exception.ptr.isSet != false) {
      kj::throwRecoverableException(&local_1f8.exception.ptr.field_1.value,0);
    }
  }
  else {
    if (local_1f8.exception.ptr.isSet == false) {
      kj::_::unreachable();
    }
    kj::throwRecoverableException(&local_1f8.exception.ptr.field_1.value,0);
  }
  if (local_1f8.exception.ptr.isSet == true) {
    kj::Exception::~Exception(&local_1f8.exception.ptr.field_1.value);
  }
  if ((local_3f5._1_4_ != 2) && (kj::_::Debug::minSeverity < 3)) {
    local_1f8.exception.ptr._0_4_ = 2;
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x4f,ERROR,"\"failed: expected \" \"(2) == (callCount)\", 2, callCount",
               (char (*) [36])"failed: expected (2) == (callCount)",(int *)&local_1f8,params);
  }
  if ((local_3f5[0] == '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[27]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability-test.c++"
               ,0x50,ERROR,"\"failed: expected \" \"barFailed\"",
               (char (*) [27])"failed: expected barFailed");
  }
  plVar3 = local_228;
  if (local_228 != (long *)0x0) {
    local_228 = (long *)0x0;
    (**(code **)*local_230)(local_230,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  plVar3 = local_380;
  if (local_380 != (long *)0x0) {
    local_380 = (long *)0x0;
    (**(code **)*local_388)(local_388,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  pPVar14 = local_3f0.ptr;
  if ((TransformPromiseNodeBase *)local_3f0.ptr != (TransformPromiseNodeBase *)0x0) {
    local_3f0.ptr = (PromiseNode *)0x0;
    (**(local_3f0.disposer)->_vptr_Disposer)
              (local_3f0.disposer,
               ((PromiseNode *)&pPVar14->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar14->_vptr_PromiseNode)->_vptr_PromiseNode);
  }
  pRVar6 = local_2d0.hook.ptr;
  if (local_2d0.hook.ptr != (RequestHook *)0x0) {
    local_2d0.hook.ptr = (RequestHook *)0x0;
    (**(local_2d0.hook.disposer)->_vptr_Disposer)
              (local_2d0.hook.disposer,
               pRVar6->_vptr_RequestHook[-2] + (long)&pRVar6->_vptr_RequestHook);
  }
  pDVar5 = local_378.hook.disposer;
  uVar9 = local_378.super_Builder._builder._32_8_;
  if (local_378.super_Builder._builder._32_8_ != 0) {
    local_378.super_Builder._builder.dataSize = 0;
    local_378.super_Builder._builder.pointerCount = 0;
    local_378.super_Builder._builder._38_2_ = 0;
    local_378.hook.disposer = (Disposer *)0x0;
    (**(local_378.hook.ptr)->_vptr_RequestHook)(local_378.hook.ptr,uVar9,8,pDVar5,pDVar5,0);
  }
  pWVar11 = local_378.super_Builder._builder.pointers;
  if (local_378.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_378.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)**local_378.super_Builder._builder.data)
              (local_378.super_Builder._builder.data,
               (long)&(pWVar11->offsetAndKind).value + *(long *)((long)*pWVar11 + -0x10));
  }
  pCVar4 = local_378.super_Builder._builder.capTable;
  if (local_378.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_378.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_378.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_378.super_Builder._builder.segment,
      (pCVar4->super_CapTableReader)._vptr_CapTableReader[-2] +
      (long)&(pCVar4->super_CapTableReader)._vptr_CapTableReader);
  }
  pRVar6 = local_308.hook.ptr;
  if (local_308.hook.ptr != (RequestHook *)0x0) {
    local_308.hook.ptr = (RequestHook *)0x0;
    (**(local_308.hook.disposer)->_vptr_Disposer)
              (local_308.hook.disposer,
               pRVar6->_vptr_RequestHook[-2] + (long)&pRVar6->_vptr_RequestHook);
  }
  if (in_stack_fffffffffffffce0 != 0) {
    (**in_stack_fffffffffffffcf0->_vptr_RequestHook)
              (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce0,8,in_stack_fffffffffffffce8,
               in_stack_fffffffffffffce8,0);
  }
  if (in_stack_fffffffffffffcd8 != (WirePointer *)0x0) {
    (**(code **)*in_stack_fffffffffffffcd0)
              (in_stack_fffffffffffffcd0,
               (long)&(in_stack_fffffffffffffcd8->offsetAndKind).value +
               *(long *)((long)*in_stack_fffffffffffffcd8 + -0x10));
  }
  pCVar4 = local_338;
  if (local_338 != (CapTableBuilder *)0x0) {
    local_338 = (CapTableBuilder *)0x0;
    (*(code *)((local_340->super_SegmentReader).arena)->_vptr_Arena)
              (local_340,
               (pCVar4->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&(pCVar4->super_CapTableReader)._vptr_CapTableReader);
  }
  pRVar6 = local_298.hook.ptr;
  if (local_298.hook.ptr != (RequestHook *)0x0) {
    local_298.hook.ptr = (RequestHook *)0x0;
    (**(local_298.hook.disposer)->_vptr_Disposer)
              (local_298.hook.disposer,
               pRVar6->_vptr_RequestHook[-2] + (long)&pRVar6->_vptr_RequestHook);
  }
  pCVar1 = local_3d8.hook.ptr;
  if (local_3d8.hook.ptr != (ClientHook *)0x0) {
    local_3d8.hook.ptr = (ClientHook *)0x0;
    (**(local_3d8.hook.disposer)->_vptr_Disposer)
              (local_3d8.hook.disposer,
               pCVar1->_vptr_ClientHook[-2] + (long)&pCVar1->_vptr_ClientHook);
  }
  kj::EventLoop::leaveScope(local_3c8.loop);
  kj::EventLoop::~EventLoop(&local_90);
  return;
}

Assistant:

TEST(Capability, Basic) {
  kj::EventLoop loop;
  kj::WaitScope waitScope(loop);

  int callCount = 0;
  test::TestInterface::Client client(kj::heap<TestInterfaceImpl>(callCount));

  auto request1 = client.fooRequest();
  request1.setI(123);
  request1.setJ(true);
  auto promise1 = request1.send();

  auto request2 = client.bazRequest();
  initTestMessage(request2.initS());
  auto promise2 = request2.send();

  bool barFailed = false;
  auto request3 = client.barRequest();
  auto promise3 = request3.send().then(
      [](Response<test::TestInterface::BarResults>&& response) {
        ADD_FAILURE() << "Expected bar() call to fail.";
      }, [&](kj::Exception&& e) {
        EXPECT_EQ(kj::Exception::Type::UNIMPLEMENTED, e.getType());
        barFailed = true;
      });

  EXPECT_EQ(0, callCount);

  auto response1 = promise1.wait(waitScope);

  EXPECT_EQ("foo", response1.getX());

  auto response2 = promise2.wait(waitScope);

  promise3.wait(waitScope);

  EXPECT_EQ(2, callCount);
  EXPECT_TRUE(barFailed);
}